

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer> * __thiscall
Memory::
AllocateArray<Memory::JitArenaAllocator,JsUtil::Pair<unsigned_int,IR::LabelInstr*,DefaultComparer>,false>
          (Memory *this,JitArenaAllocator *allocator,offset_in_JitArenaAllocator_to_subr AllocFunc,
          size_t count)

{
  undefined1 auVar1 [16];
  size_t byteSize;
  Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer> *local_68;
  size_t count_local;
  offset_in_JitArenaAllocator_to_subr AllocFunc_local;
  JitArenaAllocator *allocator_local;
  Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer> *local_10;
  
  if (count == 0) {
    ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ClearTrackAllocInfo
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this,
               (TrackAllocData *)0x0);
    local_10 = (Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer> *)0x8;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = count;
    byteSize = SUB168(auVar1 * ZEXT816(0x18),0);
    if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
      byteSize = 0xffffffffffffffff;
    }
    local_10 = (Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer> *)
               new__<Memory::JitArenaAllocator>
                         (byteSize,(JitArenaAllocator *)this,
                          (offset_in_JitArenaAllocator_to_subr)allocator);
    if (count != 0) {
      local_68 = local_10;
      do {
        JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>::Pair(local_68);
        local_68 = local_68 + 1;
      } while (local_68 != local_10 + count);
    }
  }
  return local_10;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}